

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O2

void __thiscall QPrintDialogPrivate::setTabs(QPrintDialogPrivate *this,QList<QWidget_*> *tabWidgets)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  QWidget **ppQVar3;
  QWidget **ppQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppQVar3 = (tabWidgets->d).ptr;
  for (ppQVar4 = ppQVar3; ppQVar4 != ppQVar3 + (tabWidgets->d).size; ppQVar4 = ppQVar4 + 1) {
    pQVar1 = *ppQVar4;
    pQVar2 = (QWidget *)(this->options).super_Ui_QPrintSettingsOutput.tabs;
    QWidget::windowTitle();
    QTabWidget::addTab(pQVar2,(QString *)pQVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    ppQVar3 = (tabWidgets->d).ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintDialogPrivate::setTabs(const QList<QWidget*> &tabWidgets)
{
    QList<QWidget*>::ConstIterator iter = tabWidgets.begin();
    while(iter != tabWidgets.constEnd()) {
        QWidget *tab = *iter;
        options.tabs->addTab(tab, tab->windowTitle());
        ++iter;
    }
}